

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powell.hpp
# Opt level: O1

vec3f optimize(vec3f initial,function<double_(vec3f)> *loss)

{
  double dVar1;
  bool bVar2;
  pointer pvVar3;
  pointer pdVar4;
  iterator iVar5;
  long lVar6;
  pointer pvVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  vec3f vVar11;
  initializer_list<vec3f> __l;
  vec3f d;
  vector<double,_std::allocator<double>_> improvement;
  vector<vec3f,_std::allocator<vec3f>_> dir;
  float local_10c;
  undefined8 local_108;
  float local_100;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  float local_e0;
  double local_d8;
  float local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 local_58 [16];
  vector<vec3f,_std::allocator<vec3f>_> local_48;
  
  local_10c = initial.z;
  local_98._8_4_ = in_XMM0_Dc;
  local_98._0_8_ = initial._0_8_;
  local_98._12_4_ = in_XMM0_Dd;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f800000;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3f800000;
  uStack_b0 = 0;
  local_a8 = 0x3f800000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_c8;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector(&local_48,__l,(allocator_type *)&local_d8);
  do {
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_108 = local_98._0_8_;
    local_100 = local_10c;
    local_d0 = local_10c;
    local_d8 = local_108;
    if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    dVar1 = (*loss->_M_invoker)((_Any_data *)loss,(vec3f *)&local_d8);
    pvVar3 = local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_88._0_8_ = dVar1;
    for (pvVar7 = local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                  super__Vector_impl_data._M_start; pvVar7 != pvVar3; pvVar7 = pvVar7 + 1) {
      local_e0 = pvVar7->z;
      local_e8._0_4_ = pvVar7->x;
      local_e8._4_4_ = pvVar7->y;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      local_68 = (code *)0x0;
      pcStack_60 = (code *)0x0;
      local_78._M_unused._M_object = operator_new(0x18);
      *(function<double_(vec3f)> **)local_78._M_unused._0_8_ = loss;
      *(undefined8 **)((long)local_78._M_unused._0_8_ + 8) = &local_108;
      *(undefined8 **)((long)local_78._M_unused._0_8_ + 0x10) = &local_e8;
      pcStack_60 = std::
                   _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/powell.hpp:65:27)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/powell.hpp:65:27)>
                 ::_M_manager;
      local_f8 = optimize(0.0,(function<double_(double)> *)&local_78);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      fVar8 = (float)local_f8;
      local_58._0_4_ = (float)local_e8 * fVar8 + (float)local_108;
      local_58._4_4_ = local_e8._4_4_ * fVar8 + local_108._4_4_;
      local_d0 = fVar8 * local_e0 + local_100;
      local_58._8_8_ = 0;
      local_d8._4_4_ = (data_t)local_58._4_4_;
      local_d8._0_4_ = (data_t)local_58._0_4_;
      local_f8 = (double)CONCAT44(local_f8._4_4_,local_d0);
      if ((loss->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      local_f0 = (*loss->_M_invoker)((_Any_data *)loss,(vec3f *)&local_d8);
      local_d8 = (double)local_88._0_8_ - local_f0;
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_d8);
      }
      else {
        *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_d8;
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      local_108 = (double)local_58._0_8_;
      local_100 = local_f8._0_4_;
      local_88._0_8_ = local_f0;
    }
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      bVar2 = true;
    }
    else {
      dVar1 = 0.0;
      pdVar4 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar1 = dVar1 + *pdVar4;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      bVar2 = dVar1 < 1e-05;
    }
    fVar8 = (float)local_108 - (float)local_98._0_4_;
    fVar10 = local_108._4_4_ - (float)local_98._4_4_;
    fVar9 = local_100 - local_10c;
    local_58 = ZEXT416((uint)fVar10);
    local_88 = ZEXT416((uint)fVar8);
    local_f8 = (double)CONCAT44(local_f8._4_4_,fVar9);
    fVar8 = fVar9 * fVar9 + fVar8 * fVar8 + fVar10 * fVar10;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    local_f0 = (double)CONCAT44(local_f0._4_4_,fVar8);
    iVar5 = argmax<std::vector<double,std::allocator<double>>>(&local_c8);
    fVar8 = local_100;
    fVar9 = 1.0 / local_f0._0_4_;
    lVar6 = (long)iVar5._M_current -
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6].x = (float)local_88._0_4_ * fVar9;
    local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6].y = (float)local_58._0_4_ * fVar9;
    local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6].z = local_f8._0_4_ * fVar9;
    local_98._8_8_ = 0;
    local_98._0_8_ = local_108;
    local_10c = local_100;
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (!bVar2);
  if (local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  vVar11.z = fVar8;
  vVar11.x = (data_t)local_98._0_4_;
  vVar11.y = (data_t)local_98._4_4_;
  return vVar11;
}

Assistant:

vec3f optimize(vec3f initial, std::function<double(vec3f)> loss)
{
	// Powell's method
	std::vector<vec3f> dir = {{1,0,0},{0,1,0},{0,0,1}};
	vec3f x0 = initial;
	double totalimprove = 0;
	while (true) {
		std::vector<double> improvement;
		vec3f x = x0;
		double f = loss(x0);
		for (auto d: dir) {
			double t = optimize(0, [&](double t){return loss(x+t*d);});
			vec3f x1 = x+t*d;
			double f1 = loss(x1);
			improvement.push_back(f - f1);
			x = x1;
			f = f1;
		}
		double improve = std::accumulate(improvement.begin(), improvement.end(), 0.0);
		// console.log("  improve",improve);
		totalimprove += improve;
		dir[argmax(improvement) - improvement.begin()] = normalized(x-x0);
		x0 = x;
		if (improve < 1e-5) break;
	}
	// console.log("total improve:", totalimprove);
	return x0;
}